

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

int __thiscall
QtPrivate::QCalendarDateValidator::countRepeat(QCalendarDateValidator *this,QString *str,int index)

{
  char16_t *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (str->d).size;
  lVar4 = 1;
  if (index + 1 < lVar3) {
    pcVar1 = (str->d).ptr + index;
    lVar4 = 1;
    do {
      if (pcVar1[lVar4] != *pcVar1) break;
      lVar2 = index + lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar2 + 1 < lVar3);
  }
  return (int)lVar4;
}

Assistant:

int QCalendarDateValidator::countRepeat(const QString &str, int index) const
{
    Q_ASSERT(index >= 0 && index < str.size());
    int count = 1;
    const QChar ch = str.at(index);
    while (index + count < str.size() && str.at(index + count) == ch)
        ++count;
    return count;
}